

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Irrlicht.cpp
# Opt level: O1

IrrlichtDevice *
createDevice(E_DRIVER_TYPE driverType,dimension2d<unsigned_int> *windowSize,u32 bits,bool fullscreen
            ,bool stencilbuffer,bool vsync,IEventReceiver *res)

{
  IrrlichtDevice *pIVar1;
  SIrrlichtCreationParameters local_a0;
  
  irr::SIrrlichtCreationParameters::SIrrlichtCreationParameters(&local_a0);
  local_a0.WindowSize = *windowSize;
  local_a0.Bits = (u8)bits;
  local_a0.EventReceiver = res;
  local_a0.DriverType = driverType;
  local_a0.Fullscreen = fullscreen;
  local_a0.Stencilbuffer = stencilbuffer;
  local_a0.Vsync = vsync;
  pIVar1 = createDeviceEx(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.OGLES2ShaderPath.str._M_dataplus._M_p != &local_a0.OGLES2ShaderPath.str.field_2) {
    operator_delete(local_a0.OGLES2ShaderPath.str._M_dataplus._M_p,
                    local_a0.OGLES2ShaderPath.str.field_2._M_allocated_capacity + 1);
  }
  return pIVar1;
}

Assistant:

createDevice(video::E_DRIVER_TYPE driverType,
		const core::dimension2d<u32> &windowSize,
		u32 bits, bool fullscreen,
		bool stencilbuffer, bool vsync, IEventReceiver *res)
{
	(void)copyright; // prevent unused variable warning

	SIrrlichtCreationParameters p;
	p.DriverType = driverType;
	p.WindowSize = windowSize;
	p.Bits = (u8)bits;
	p.Fullscreen = fullscreen;
	p.Stencilbuffer = stencilbuffer;
	p.Vsync = vsync;
	p.EventReceiver = res;

	return createDeviceEx(p);
}